

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

void __thiscall lzham::lzcompressor::clear(lzcompressor *this)

{
  parse_thread_state *ppVar1;
  uchar *puVar2;
  lzdecision *p;
  undefined1 auVar3 [16];
  long lVar4;
  lzcompressor *plVar5;
  uint i;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar8;
  
  symbol_codec::clear(&this->m_codec);
  this->m_src_size = 0;
  this->m_src_adler32 = 1;
  puVar2 = (this->m_block_buf).m_p;
  if (puVar2 != (uchar *)0x0) {
    lzham_free(puVar2);
    (this->m_block_buf).m_p = (uchar *)0x0;
    (this->m_block_buf).m_size = 0;
    (this->m_block_buf).m_capacity = 0;
  }
  puVar2 = (this->m_comp_buf).m_p;
  if (puVar2 != (uchar *)0x0) {
    lzham_free(puVar2);
    (this->m_comp_buf).m_p = (uchar *)0x0;
    (this->m_comp_buf).m_size = 0;
    (this->m_comp_buf).m_capacity = 0;
  }
  lVar6 = 0;
  *(undefined8 *)((long)&this->m_block_start_dict_ofs + 2) = 0;
  this->m_step = 0;
  this->m_block_start_dict_ofs = 0;
  state::clear(&this->m_state);
  this->m_num_parse_threads = 0;
  this->m_parse_jobs_remaining = 0;
  plVar5 = this;
  do {
    ppVar1 = this->m_parse_thread_state + lVar6;
    state::clear(&this->m_parse_thread_state[lVar6].super_raw_parse_thread_state.m_approx_state);
    auVar3 = _DAT_00122390;
    lVar4 = 0x11810;
    auVar7 = _DAT_00122380;
    auVar9 = _DAT_00122370;
    do {
      auVar10 = auVar7 ^ auVar3;
      if (auVar10._4_4_ == -0x80000000 && auVar10._0_4_ < -0x7ffff3ff) {
        *(undefined4 *)((long)plVar5 + lVar4 + -0x2b8) = 0;
        *(undefined4 *)((long)plVar5 + lVar4 + -0x1d0) = 0;
      }
      auVar10 = auVar9 ^ auVar3;
      if (auVar10._4_4_ == -0x80000000 && auVar10._0_4_ < -0x7ffff3ff) {
        *(undefined4 *)((long)plVar5 + lVar4 + -0xe8) = 0;
        *(undefined4 *)
         ((long)(plVar5->super_CLZBase).super_CLZDecompBase.m_lzx_position_base + lVar4 + -0xc) = 0;
      }
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 4;
      auVar7._8_8_ = lVar8 + 4;
      lVar8 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar8 + 4;
      lVar4 = lVar4 + 0x3a0;
    } while (lVar4 != 0xbfbb0);
    (ppVar1->super_raw_parse_thread_state).m_start_ofs = 0;
    (ppVar1->super_raw_parse_thread_state).m_bytes_to_match = 0;
    p = (ppVar1->super_raw_parse_thread_state).m_best_decisions.m_p;
    if (p != (lzdecision *)0x0) {
      lzham_free(p);
      (ppVar1->super_raw_parse_thread_state).m_best_decisions.m_p = (lzdecision *)0x0;
      (ppVar1->super_raw_parse_thread_state).m_best_decisions.m_size = 0;
      (ppVar1->super_raw_parse_thread_state).m_best_decisions.m_capacity = 0;
    }
    (ppVar1->super_raw_parse_thread_state).m_emit_decisions_backwards = false;
    (ppVar1->super_raw_parse_thread_state).m_issued_reset_state_partial = false;
    (ppVar1->super_raw_parse_thread_state).m_failed = false;
    lVar6 = lVar6 + 1;
    plVar5 = (lzcompressor *)
             &plVar5->m_parse_thread_state[0].super_raw_parse_thread_state.m_nodes[0xb20].
              m_node_states[2].m_total_complexity;
  } while (lVar6 != 8);
  return;
}

Assistant:

void lzcompressor::clear()
   {
      m_codec.clear();
      m_src_size = 0;
      m_src_adler32 = cInitAdler32;
      m_block_buf.clear();
      m_comp_buf.clear();

      m_step = 0;
      m_finished = false;
      m_use_task_pool = false;
      m_block_start_dict_ofs = 0;
      m_block_index = 0;
      m_state.clear();
      m_num_parse_threads = 0;
      m_parse_jobs_remaining = 0;

      for (uint i = 0; i < cMaxParseThreads; i++)
      {
         parse_thread_state &parse_state = m_parse_thread_state[i];
         parse_state.m_approx_state.clear();

         for (uint j = 0; j <= cMaxParseGraphNodes; j++)
            parse_state.m_nodes[j].clear();

         parse_state.m_start_ofs = 0;
         parse_state.m_bytes_to_match = 0;
         parse_state.m_best_decisions.clear();
         parse_state.m_issued_reset_state_partial = false;
         parse_state.m_emit_decisions_backwards = false;
         parse_state.m_failed = false;
      }
   }